

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushClipRect(ImVec2 *clip_rect_min,ImVec2 *clip_rect_max,
                        bool intersect_with_current_clip_rect)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec4 *pIVar5;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  ImDrawList::PushClipRect
            (pIVar1->DrawList,*clip_rect_min,*clip_rect_max,intersect_with_current_clip_rect);
  pIVar5 = ImVector<ImVec4>::back(&pIVar1->DrawList->_ClipRectStack);
  fVar2 = pIVar5->y;
  fVar3 = pIVar5->z;
  fVar4 = pIVar5->w;
  (pIVar1->ClipRect).Min.x = pIVar5->x;
  (pIVar1->ClipRect).Min.y = fVar2;
  (pIVar1->ClipRect).Max.x = fVar3;
  (pIVar1->ClipRect).Max.y = fVar4;
  return;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}